

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::calculateIntersections(ComplexToSimple *this)

{
  Event *pEVar1;
  long lVar2;
  ulong uVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *node;
  uint edgeIndex;
  Node *node_00;
  Node *after;
  Edge *pEVar7;
  Node *pNVar8;
  long in_FS_OFFSET;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar13;
  QIntersectionPoint p;
  Intersection local_b0;
  QIntersectionPoint local_78;
  QPodPoint local_48;
  undefined8 uStack_40;
  Node *local_38;
  
  local_38 = *(Node **)(in_FS_OFFSET + 0x28);
  fillPriorityQueue(this);
  lVar2 = (this->m_events).siz;
  if (lVar2 != 0) {
    do {
      pEVar1 = (this->m_events).buffer + lVar2 + -1;
      local_48 = pEVar1->point;
      uStack_40 = *(Node **)&pEVar1->type;
      sortEdgeList(this,local_48);
      node_00 = (Node *)&local_48;
      pVar13 = bounds(this,(QPodPoint *)node_00);
      pNVar5 = pVar13.first;
      if (pNVar5 == (Node *)0x0) {
        after = (Node *)0x0;
      }
      else {
        pNVar4 = pNVar5->left;
        pNVar6 = pNVar5;
        if (pNVar5->left == (Node *)0x0) {
          do {
            after = pNVar6->parent;
            if (after == (Node *)0x0) break;
            bVar9 = pNVar6 == after->left;
            pNVar6 = after;
          } while (bVar9);
        }
        else {
          do {
            after = pNVar4;
            pNVar4 = after->right;
          } while (after->right != (Node *)0x0);
        }
      }
      lVar2 = (long)(int)uStack_40._4_4_;
      if ((int)uStack_40 == 0) {
        pEVar7 = (this->m_edges).buffer;
        uVar3 = (ulong)pEVar7[lVar2].pointingUp;
      }
      else {
        pEVar7 = (this->m_edges).buffer;
        uVar3 = (ulong)(pEVar7[lVar2].pointingUp ^ 1);
      }
      local_78.upperLeft = local_48;
      local_78.xOffset.numerator = 0;
      local_78.xOffset.denominator = 1;
      local_78.yOffset.numerator = 0;
      local_78.yOffset.denominator = 1;
      if (pNVar5 != (Node *)0x0) {
        splitEdgeListRange(this,pNVar5,pVar13.second,(&pEVar7[lVar2].from)[uVar3],&local_78);
        reorderEdgeListRange(this,pNVar5,pVar13.second);
        node_00 = pNVar5;
      }
LAB_0044d4e1:
      while (lVar2 = (this->m_events).siz, lVar2 != 0) {
        pEVar1 = (this->m_events).buffer;
        iVar11 = -(uint)(local_48.x == pEVar1[lVar2 + -1].point.x);
        iVar12 = -(uint)(local_48.y == pEVar1[lVar2 + -1].point.y);
        auVar10._4_4_ = iVar11;
        auVar10._0_4_ = iVar11;
        auVar10._8_4_ = iVar12;
        auVar10._12_4_ = iVar12;
        iVar11 = movmskpd((int)node_00,auVar10);
        if (iVar11 != 3) break;
        local_48 = pEVar1[lVar2 + -1].point;
        pNVar5 = *(Node **)&pEVar1[lVar2 + -1].type;
        (this->m_events).siz = lVar2 + -1;
        uStack_40._4_4_ = (uint)((ulong)pNVar5 >> 0x20);
        edgeIndex = uStack_40._4_4_;
        lVar2 = (long)(int)uStack_40._4_4_;
        pEVar7 = (this->m_edges).buffer;
        node_00 = pEVar7[lVar2].node;
        uStack_40 = pNVar5;
        if (node_00 == (Node *)0x0) goto LAB_0044d5f4;
        pNVar5 = node_00->left;
        pNVar4 = node_00;
        if (node_00->left == (Node *)0x0) {
          do {
            pNVar6 = pNVar4->parent;
            if (pNVar6 == (Node *)0x0) break;
            bVar9 = pNVar4 == pNVar6->left;
            pNVar4 = pNVar6;
          } while (bVar9);
        }
        else {
          do {
            pNVar6 = pNVar5;
            pNVar5 = pNVar6->right;
          } while (pNVar6->right != (Node *)0x0);
        }
        pNVar5 = node_00->right;
        pNVar4 = node_00;
        if (node_00->right == (Node *)0x0) {
          do {
            pNVar8 = pNVar4->parent;
            if (pNVar8 == (Node *)0x0) break;
            bVar9 = pNVar4 == pNVar8->right;
            pNVar4 = pNVar8;
          } while (bVar9);
        }
        else {
          do {
            pNVar8 = pNVar5;
            pNVar5 = pNVar8->left;
          } while (pNVar8->left != (Node *)0x0);
        }
        pEVar7 = pEVar7 + lVar2;
        QRBTree<int>::detach(&this->m_edgeList,node_00);
        pEVar7->node->right = (this->m_edgeList).freeList;
        (this->m_edgeList).freeList = pEVar7->node;
        pEVar7->node = (Node *)0x0;
        if ((pNVar6 != (Node *)0x0) && (pNVar8 != (Node *)0x0)) {
          edgeIndex = pNVar6->data;
          goto LAB_0044d69d;
        }
      }
      lVar2 = (this->m_topIntersection).m_data.siz;
      while ((lVar2 != 0 &&
             (bVar9 = QIntersectionPoint::operator<
                                (&local_78,
                                 &((this->m_topIntersection).m_data.buffer)->intersectionPoint),
             !bVar9))) {
        QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::pop
                  (&local_b0,&this->m_topIntersection);
        lVar2 = (this->m_topIntersection).m_data.siz;
      }
      lVar2 = (this->m_events).siz;
    } while (lVar2 != 0);
  }
  lVar2 = (long)(this->m_processedEdgePairs).m_capacity;
  if (0 < lVar2) {
    memset((this->m_processedEdgePairs).m_array,0xff,lVar2 << 3);
  }
  (this->m_processedEdgePairs).m_count = 0;
  if (*(Node **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_0044d5f4:
  pNVar4 = searchEdgeLeftOf(this,edgeIndex,after);
  pNVar5 = (this->m_edgeList).freeList;
  if (pNVar5 == (Node *)0x0) {
    pNVar5 = (Node *)operator_new(0x28);
  }
  else {
    (this->m_edgeList).freeList = pNVar5->right;
  }
  pNVar5->parent = (Node *)0x0;
  pNVar5->left = (Node *)0x0;
  pNVar5->right = (Node *)0x0;
  pNVar5->red = true;
  (this->m_edges).buffer[lVar2].node = pNVar5;
  node_00 = pNVar4;
  QRBTree<int>::attachAfter(&this->m_edgeList,pNVar4,pNVar5);
  pNVar5 = (this->m_edges).buffer[lVar2].node;
  pNVar5->data = edgeIndex;
  pNVar6 = pNVar5->right;
  if (pNVar5->right == (Node *)0x0) {
    do {
      pNVar8 = pNVar5->parent;
      if (pNVar8 == (Node *)0x0) break;
      bVar9 = pNVar5 == pNVar8->right;
      pNVar5 = pNVar8;
    } while (bVar9);
  }
  else {
    do {
      pNVar8 = pNVar6;
      pNVar6 = pNVar8->left;
    } while (pNVar8->left != (Node *)0x0);
  }
  if (pNVar4 != (Node *)0x0) {
    node_00 = (Node *)(ulong)(uint)pNVar4->data;
    calculateIntersection(this,pNVar4->data,edgeIndex);
  }
  if (pNVar8 != (Node *)0x0) {
LAB_0044d69d:
    node_00 = (Node *)(ulong)edgeIndex;
    calculateIntersection(this,edgeIndex,pNVar8->data);
  }
  goto LAB_0044d4e1;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::calculateIntersections()
{
    fillPriorityQueue();

    Q_ASSERT(m_topIntersection.empty());
    Q_ASSERT(m_edgeList.root == nullptr);

    // Find all intersection points.
    while (!m_events.isEmpty()) {
        Event event = m_events.last();
        sortEdgeList(event.point);

        // Find all edges in the edge list that contain the current vertex and mark them to be split later.
        std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> range = bounds(event.point);
        QRBTree<int>::Node *leftNode = range.first ? m_edgeList.previous(range.first) : nullptr;
        int vertex = (event.type == Event::Upper ? m_edges.at(event.edge).upper() : m_edges.at(event.edge).lower());
        QIntersectionPoint eventPoint = QT_PREPEND_NAMESPACE(qIntersectionPoint)(event.point);

        if (range.first != nullptr) {
            splitEdgeListRange(range.first, range.second, vertex, eventPoint);
            reorderEdgeListRange(range.first, range.second);
        }

        // Handle the edges with start or end point in the current vertex.
        while (!m_events.isEmpty() && m_events.last().point == event.point) {
            event = m_events.last();
            m_events.pop_back();
            int i = event.edge;

            if (m_edges.at(i).node) {
                // Remove edge from edge list.
                Q_ASSERT(event.type == Event::Lower);
                QRBTree<int>::Node *left = m_edgeList.previous(m_edges.at(i).node);
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                m_edgeList.deleteNode(m_edges.at(i).node);
                if (!left || !right)
                    continue;
                calculateIntersection(left->data, right->data);
            } else {
                // Insert edge into edge list.
                Q_ASSERT(event.type == Event::Upper);
                QRBTree<int>::Node *left = searchEdgeLeftOf(i, leftNode);
                m_edgeList.attachAfter(left, m_edges.at(i).node = m_edgeList.newNode());
                m_edges.at(i).node->data = i;
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                if (left)
                    calculateIntersection(left->data, i);
                if (right)
                    calculateIntersection(i, right->data);
            }
        }
        while (!m_topIntersection.isEmpty() && m_topIntersection.top().intersectionPoint <= eventPoint)
            m_topIntersection.pop();
#ifdef Q_TRIANGULATOR_DEBUG
        DebugDialog dialog(this, vertex);
        dialog.exec();
#endif
    }
    m_processedEdgePairs.clear();
}